

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbsdf.c
# Opt level: O0

void first_pass(BSDF_Worker *worker)

{
  int width;
  int iVar1;
  ED *pEVar2;
  ED *current_00;
  ED *current;
  FT_Int index;
  ED *dm;
  FT_Int r;
  FT_Int w;
  FT_Int j;
  FT_Int i;
  BSDF_Worker *worker_local;
  
  pEVar2 = worker->distance_map;
  width = worker->width;
  iVar1 = worker->rows;
  for (r = 1; r < iVar1; r = r + 1) {
    for (w = 1; w < width + -1; w = w + 1) {
      current_00 = pEVar2 + (r * width + w);
      compare_neighbor(current_00,-1,-1,width);
      compare_neighbor(current_00,0,-1,width);
      compare_neighbor(current_00,1,-1,width);
      compare_neighbor(current_00,-1,0,width);
    }
    for (w = width + -2; -1 < w; w = w + -1) {
      compare_neighbor(pEVar2 + (r * width + w),1,0,width);
    }
  }
  return;
}

Assistant:

static void
  first_pass( BSDF_Worker*  worker )
  {
    FT_Int  i, j; /* iterators    */
    FT_Int  w, r; /* width, rows  */
    ED*     dm;   /* distance map */


    dm = worker->distance_map;
    w  = worker->width;
    r  = worker->rows;

    /* Start scanning from top to bottom and sweep each    */
    /* row back and forth comparing the distances of the   */
    /* neighborhood.  Leave the first row as it has no top */
    /* neighbor; it will be covered in the second scan of  */
    /* the image (from bottom to top).                     */
    for ( j = 1; j < r; j++ )
    {
      FT_Int  index;
      ED*     current;


      /* Forward pass of rows (left -> right).  Leave the first  */
      /* column, which gets covered in the backward pass.        */
      for ( i = 1; i < w - 1; i++ )
      {
        index   = j * w + i;
        current = dm + index;

        /* left-up */
        compare_neighbor( current, -1, -1, w );
        /* up */
        compare_neighbor( current,  0, -1, w );
        /* up-right */
        compare_neighbor( current,  1, -1, w );
        /* left */
        compare_neighbor( current, -1,  0, w );
      }

      /* Backward pass of rows (right -> left).  Leave the last */
      /* column, which was already covered in the forward pass. */
      for ( i = w - 2; i >= 0; i-- )
      {
        index   = j * w + i;
        current = dm + index;

        /* right */
        compare_neighbor( current, 1, 0, w );
      }
    }
  }